

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gus_pat.cpp
# Opt level: O1

int convert_8srp(uchar *data,_sample *gus_sample)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  short *psVar7;
  int *piVar8;
  uint uVar9;
  long lVar11;
  long lVar12;
  ulong uVar13;
  byte *pbVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar10;
  
  uVar3 = gus_sample->loop_end;
  uVar4 = gus_sample->data_length;
  uVar17 = (ulong)uVar4;
  uVar5 = gus_sample->loop_start;
  uVar9 = uVar3 - uVar5;
  uVar10 = (ulong)uVar9;
  psVar7 = (short *)calloc(uVar17 + uVar10 * 2 + 2,2);
  gus_sample->data = psVar7;
  if (psVar7 == (short *)0x0) {
    piVar8 = __errno_location();
    _WM_ERROR("convert_8srp",0xcc,1,"to parse sample",*piVar8);
    iVar6 = -1;
  }
  else {
    lVar1 = uVar10 * 2;
    uVar13 = uVar10 * 4 ^ 0xfffffffffffffffc;
    lVar16 = -1;
    lVar11 = 0;
    do {
      psVar7[lVar11] = (ushort)data[lVar16 + uVar17] << 8;
      lVar11 = lVar11 + 1;
      uVar13 = uVar13 - 2;
      lVar16 = lVar16 + -1;
    } while (~(ulong)uVar3 + uVar17 != lVar11);
    pbVar14 = data + (uVar17 - lVar11) + -2;
    bVar2 = data[lVar16 + uVar17];
    psVar7[lVar11] = (ushort)bVar2 << 8;
    psVar7[lVar11 + uVar10 * 2] = (ushort)bVar2 << 8;
    lVar15 = lVar1 + lVar11 + 1;
    lVar16 = lVar1 + lVar11;
    do {
      lVar12 = lVar11;
      lVar16 = lVar16 + -1;
      bVar2 = *pbVar14;
      pbVar14 = pbVar14 + -1;
      psVar7[lVar12 + 1] = (ushort)bVar2 << 8;
      psVar7[lVar16] = (ushort)bVar2 << 8;
      psVar7[lVar15] = psVar7[lVar12 + 1];
      uVar13 = uVar13 - 2;
      lVar11 = lVar12 + 1;
      lVar15 = lVar15 + 1;
    } while ((uVar17 - uVar5) + -2 != lVar11);
    bVar2 = *pbVar14;
    psVar7[lVar12 + 2] = (ushort)bVar2 << 8;
    psVar7[lVar15] = (ushort)bVar2 << 8;
    psVar7 = (short *)((long)psVar7 - uVar13);
    lVar11 = -lVar11;
    do {
      *psVar7 = (ushort)data[lVar11 + (uVar17 - 3)] << 8;
      lVar11 = lVar11 + -1;
      psVar7 = psVar7 + 2;
    } while (2 - uVar17 != lVar11);
    gus_sample->loop_start = uVar3;
    gus_sample->loop_end = (int)lVar1 + uVar3;
    gus_sample->data_length = uVar4 + uVar9 * 2;
    gus_sample->modes = gus_sample->modes ^ 0x18;
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static int convert_8srp(unsigned char *data, struct _sample *gus_sample) {
	unsigned long int loop_length = gus_sample->loop_end
			- gus_sample->loop_start;
	unsigned long int dloop_length = loop_length * 2;
	unsigned long int new_length = gus_sample->data_length + dloop_length;
	unsigned char *read_data = data + gus_sample->data_length - 1;
	unsigned char *read_end = data + gus_sample->loop_end;
	signed short int *write_data = NULL;
	signed short int *write_data_a = NULL;
	signed short int *write_data_b = NULL;

	SAMPLE_CONVERT_DEBUG(__FUNCTION__);
	gus_sample->data = (short*)calloc((new_length + 2), sizeof(signed short int));
	if (gus_sample->data != NULL) {
		write_data = gus_sample->data;
		do {
			*write_data++ = (*read_data--) << 8;
		} while (read_data != read_end);

		*write_data = (*read_data-- << 8);
		write_data_a = write_data + dloop_length;
		*write_data_a-- = *write_data;
		write_data++;
		write_data_b = write_data + dloop_length;
		read_end = data + gus_sample->loop_start;
		do {
			*write_data = (*read_data--) << 8;
			*write_data_a-- = *write_data;
			*write_data_b++ = *write_data;
			write_data++;
		} while (read_data != read_end);

		*write_data = (*read_data-- << 8);
		*write_data_b++ = *write_data;
		read_end = data - 1;
		do {
			*write_data_b++ = (*read_data--) << 8;
			write_data_b++;
		} while (read_data != read_end);
		gus_sample->loop_start += loop_length;
		gus_sample->loop_end += dloop_length;
		gus_sample->data_length = new_length;
		gus_sample->modes ^= SAMPLE_PINGPONG | SAMPLE_REVERSE;
		return 0;
	}

	_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_MEM, "to parse sample", errno);
	return -1;
}